

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# long_branch_link.c
# Opt level: O2

void long_branch_link(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = thminstr->raw & 0x7ff;
  if ((thminstr->raw >> 0xb & 1) == 0) {
    uVar2 = sign_extend_word(uVar6,0xb,0x20);
    uVar6 = uVar2 * 0x1000 + state->pc;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",0xe,(ulong)uVar6);
    }
    switch((state->cpsr).raw & 0x1f) {
    case 0x11:
      state->lr_fiq = uVar6;
      break;
    case 0x12:
      state->lr_irq = uVar6;
      break;
    case 0x13:
      state->lr_svc = uVar6;
      break;
    default:
      state->lr = uVar6;
      break;
    case 0x17:
      state->lr_abt = uVar6;
      break;
    case 0x1b:
      state->lr_und = uVar6;
    }
    return;
  }
  uVar3 = (state->cpsr).raw;
  uVar5 = (uVar3 & 0x1f) - 0x11;
  lVar4 = 0x98;
  if (uVar5 < 0xb) {
    lVar4 = *(long *)(&DAT_00121538 + (ulong)uVar5 * 8);
  }
  iVar1 = *(int *)((long)state->r + lVar4 + -0x38);
  uVar5 = (state->pc | 1) - 2;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xe,(ulong)uVar5);
    uVar3 = (state->cpsr).raw;
  }
  switch(uVar3 & 0x1f) {
  case 0x11:
    state->lr_fiq = uVar5;
    break;
  case 0x12:
    state->lr_irq = uVar5;
    break;
  case 0x13:
    state->lr_svc = uVar5;
    break;
  default:
    state->lr = uVar5;
    break;
  case 0x17:
    state->lr_abt = uVar5;
    break;
  case 0x1b:
    state->lr_und = uVar5;
  }
  uVar6 = iVar1 + uVar6 * 2 + 1;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xf,(ulong)uVar6);
    uVar3 = (state->cpsr).raw;
  }
  if ((uVar3 & 0x20) == 0) {
    uVar2 = uVar6 & 0xfffffffe;
  }
  else {
    uVar2 = uVar6 | 1;
  }
  set_pc(state,uVar2);
  return;
}

Assistant:

void long_branch_link(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    long_branch_link_t* instr = &thminstr->LONG_BRANCH_LINK;
    word offset = instr->offset;

    if (instr->h) {
        offset <<= 1;
        word oldlr = get_register(state, REG_LR);
        word oldpc = get_register(state, REG_PC);
        word full_address = oldlr + offset + 1;
        set_register(state, REG_LR, (oldpc - 2) | 1);
        set_register(state, REG_PC, full_address);
    } else {
        offset = sign_extend_word(offset, 11, 32);
        offset <<= 12;
        set_register(state, REG_LR, state->pc + offset);
    }

}